

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValues
          (FunctionalTest16 *this,_test_case *test_case,uint *n_id,
          _subroutine_uniform_value_verification *verification)

{
  uint n_stage;
  long lVar1;
  _shader_stage *stages [5];
  _shader_stage *local_48 [6];
  
  local_48[2] = (_shader_stage *)0x0;
  local_48[3] = (_shader_stage *)0x0;
  local_48[0] = (_shader_stage *)0x0;
  local_48[1] = (_shader_stage *)0x0;
  local_48[4] = (_shader_stage *)0x0;
  getShaderStages(this,*test_case == TEST_CASE_FIRST,n_id,local_48);
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    verifySubroutineUniformValuesForShaderStage(this,local_48[lVar1],verification);
  }
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValues(const _test_case& test_case, const unsigned int& n_id,
													 const _subroutine_uniform_value_verification& verification)
{
	const _shader_stage* stages[] = {
		DE_NULL, /* fragment shader     stage slot */
		DE_NULL, /* geometry shader     stage slot */
		DE_NULL, /* tess control shader stage slot */
		DE_NULL, /* tess eval shader    stage slot */
		DE_NULL  /* vertex shader       stage slot */
	};
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	/* Verify that currently reported subroutine uniform values are equal to default values */
	getShaderStages(test_case == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT, n_id, stages);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		const _shader_stage& current_stage = *(stages[n_stage]);

		verifySubroutineUniformValuesForShaderStage(current_stage, verification);
	} /* for (all items) */
}